

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O1

QFbScreen * __thiscall QFbScreen::doRedraw(QFbScreen *this)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  QRect *pQVar5;
  QFbBackingStore *this_00;
  undefined4 uVar6;
  QRect QVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Representation RVar11;
  char cVar12;
  int iVar13;
  QPainter *this_01;
  undefined8 *puVar14;
  undefined8 *puVar15;
  QList<QFbWindow_*> *this_02;
  pointer ppQVar16;
  undefined8 uVar17;
  int iVar18;
  int iVar19;
  GlobalColor GVar20;
  long in_RSI;
  int iVar21;
  long in_FS_OFFSET;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 local_b0 [24];
  undefined1 local_98 [12];
  Representation RStack_8c;
  AtomicType local_88;
  undefined8 uStack_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(in_RSI + 0x50);
  iVar3 = *(int *)(in_RSI + 0x54);
  *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  if (((*(long **)(in_RSI + 0x48) != (long *)0x0) &&
      (cVar12 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))(), cVar12 != '\0')) &&
     (cVar12 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb0))(), cVar12 != '\0')) {
    local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_58._0_8_ = 0xaaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [16])QFbCursor::dirtyRect(*(QFbCursor **)(in_RSI + 0x48));
    QRegion::operator+=((QRegion *)(in_RSI + 0x38),(QRect *)local_58);
  }
  pQVar1 = (QRect *)(in_RSI + 0x38);
  cVar12 = QRegion::isEmpty();
  QVar7.x2.m_i = local_98._8_4_;
  QVar7.y2.m_i = RStack_8c.m_i;
  QVar7.x1.m_i = local_98._0_4_;
  QVar7.y1.m_i = local_98._4_4_;
  if (cVar12 != '\0') {
    if (*(long **)(in_RSI + 0x48) == (long *)0x0) goto LAB_001141d0;
    cVar12 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    QVar7.x2.m_i = local_98._8_4_;
    QVar7.y2.m_i = RStack_8c.m_i;
    QVar7.x1.m_i = local_98._0_4_;
    QVar7.y1.m_i = local_98._4_4_;
    if (cVar12 == '\0') goto LAB_001141d0;
  }
  if (*(long *)(in_RSI + 0x90) == 0) {
    this_01 = (QPainter *)operator_new(8);
    QPainter::QPainter(this_01,(QPaintDevice *)(in_RSI + 0x78));
    *(QPainter **)(in_RSI + 0x90) = this_01;
  }
  local_88._M_b._M_p._0_4_ = *(int *)(in_RSI + 0x50) - iVar2;
  uStack_80._0_4_ = *(int *)(in_RSI + 0x58) - iVar2;
  local_88._M_b._M_p._4_4_ = *(int *)(in_RSI + 0x54) - iVar3;
  uStack_80._4_4_ = *(int *)(in_RSI + 0x5c) - iVar3;
  puVar14 = (undefined8 *)QRegion::begin();
  puVar15 = (undefined8 *)QRegion::end();
  if (puVar14 != puVar15) {
    this_02 = (QList<QFbWindow_*> *)(in_RSI + 0x20);
    do {
      local_98._0_8_ = *puVar14;
      unique0x100004ad = puVar14[1];
      _local_98 = (QRect)QRect::operator&((QRect *)local_98,(QRect *)&local_88);
      auVar22._0_4_ = -(uint)(local_98._8_4_.m_i < local_98._0_4_.m_i);
      iVar23 = -(uint)(local_98._12_4_.m_i < local_98._4_4_.m_i);
      auVar22._4_4_ = auVar22._0_4_;
      auVar22._8_4_ = iVar23;
      auVar22._12_4_ = iVar23;
      iVar23 = movmskpd(local_98._0_4_.m_i,auVar22);
      if (iVar23 == 0) {
        QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
        pQVar5 = *(QRect **)(in_RSI + 0x90);
        cVar12 = QImage::hasAlphaChannel();
        GVar20 = black;
        if (cVar12 != '\0') {
          GVar20 = transparent;
        }
        QColor::QColor((QColor *)local_58,GVar20);
        QPainter::fillRect(pQVar5,(QColor *)local_98);
        iVar23 = *(int *)(in_RSI + 0x30);
        while (iVar23 != 0) {
          iVar23 = iVar23 + -1;
          QList<QFbWindow_*>::data(this_02);
          QPlatformWindow::window();
          cVar12 = QWindow::isVisible();
          if (cVar12 != '\0') {
            ppQVar16 = QList<QFbWindow_*>::data(this_02);
            uVar17 = (**(code **)(*(long *)ppQVar16[iVar23] + 0x30))();
            uVar8 = local_98._0_4_;
            uVar9 = local_98._4_4_;
            uVar10 = local_98._8_4_;
            RVar11.m_i = RStack_8c.m_i;
            ppQVar16 = QList<QFbWindow_*>::data(this_02);
            this_00 = ppQVar16[iVar23]->mBackingStore;
            if (this_00 != (QFbBackingStore *)0x0) {
              iVar13 = (int)((ulong)uVar17 >> 0x20) - iVar3;
              iVar19 = (int)uVar17 - iVar2;
              iVar21 = uVar9 - iVar13;
              iVar18 = uVar8 - iVar19;
              QFbBackingStore::lock(this_00);
              uVar17 = *(undefined8 *)(in_RSI + 0x90);
              QFbBackingStore::image((QFbBackingStore *)local_b0);
              local_58._8_8_ = (double)local_98._4_4_.m_i;
              local_58._0_8_ = (double)local_98._0_4_.m_i;
              local_48 = (double)(((long)(int)local_98._8_4_ - (long)local_98._0_4_.m_i) + 1);
              local_40 = (double)(((long)RStack_8c.m_i - (long)local_98._4_4_.m_i) + 1);
              local_78 = (double)iVar18;
              local_70 = (double)iVar21;
              local_68 = (double)(((long)(uVar10 - iVar19) - (long)iVar18) + 1);
              local_60 = (double)(((long)(RVar11.m_i - iVar13) - (long)iVar21) + 1);
              QPainter::drawImage(uVar17,local_58,(QFbBackingStore *)local_b0,&local_78,0);
              QImage::~QImage((QImage *)local_b0);
              QFbBackingStore::unlock(this_00);
            }
          }
        }
      }
      puVar14 = puVar14 + 2;
    } while (puVar14 != puVar15);
  }
  if (*(long **)(in_RSI + 0x48) != (long *)0x0) {
    cVar12 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    if (cVar12 == '\0') {
      local_58 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb8))();
      cVar12 = QRegion::intersects(pQVar1);
      if (cVar12 == '\0') goto LAB_001141a1;
    }
    QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
    local_58 = (**(code **)(**(long **)(in_RSI + 0x48) + 0x98))
                         (*(long **)(in_RSI + 0x48),*(undefined8 *)(in_RSI + 0x90));
    QRegion::operator+=((QRegion *)this,(QRect *)local_58);
  }
LAB_001141a1:
  QRegion::operator+=((QRegion *)this,(QRegion *)pQVar1);
  QRegion::QRegion((QRegion *)local_58);
  auVar22 = local_58;
  uVar4 = pQVar1->x1;
  uVar6 = pQVar1->y1;
  local_58._4_4_ = uVar6;
  local_58._0_4_ = uVar4;
  uVar17 = local_58._0_8_;
  local_58._0_8_ = auVar22._0_8_;
  pQVar1->x1 = (Representation)local_58._0_4_;
  pQVar1->y1 = (Representation)local_58._4_4_;
  local_58._8_8_ = auVar22._8_8_;
  local_58 = CONCAT88(local_58._8_8_,uVar17);
  QRegion::~QRegion((QRegion *)local_58);
  QVar7 = _local_98;
LAB_001141d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    _local_98 = QVar7;
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QRegion QFbScreen::doRedraw()
{
    const QPoint screenOffset = mGeometry.topLeft();

    QRegion touchedRegion;
    if (mCursor && mCursor->isDirty() && mCursor->isOnScreen()) {
        const QRect lastCursor = mCursor->dirtyRect();
        mRepaintRegion += lastCursor;
    }
    if (mRepaintRegion.isEmpty() && (!mCursor || !mCursor->isDirty()))
        return touchedRegion;

    if (!mPainter)
        mPainter = new QPainter(&mScreenImage);

    const QRect screenRect = mGeometry.translated(-screenOffset);
    for (QRect rect : mRepaintRegion) {
        rect = rect.intersected(screenRect);
        if (rect.isEmpty())
            continue;

        mPainter->setCompositionMode(QPainter::CompositionMode_Source);
        mPainter->fillRect(rect, mScreenImage.hasAlphaChannel() ? Qt::transparent : Qt::black);

        for (int layerIndex = mWindowStack.size() - 1; layerIndex != -1; layerIndex--) {
            if (!mWindowStack[layerIndex]->window()->isVisible())
                continue;

            const QRect windowRect = mWindowStack[layerIndex]->geometry().translated(-screenOffset);
            const QRect windowIntersect = rect.translated(-windowRect.left(), -windowRect.top());
            QFbBackingStore *backingStore = mWindowStack[layerIndex]->backingStore();
            if (backingStore) {
                backingStore->lock();
                mPainter->drawImage(rect, backingStore->image(), windowIntersect);
                backingStore->unlock();
            }
        }
    }

    if (mCursor && (mCursor->isDirty() || mRepaintRegion.intersects(mCursor->lastPainted()))) {
        mPainter->setCompositionMode(QPainter::CompositionMode_SourceOver);
        touchedRegion += mCursor->drawCursor(*mPainter);
    }
    touchedRegion += mRepaintRegion;
    mRepaintRegion = QRegion();

    return touchedRegion;
}